

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O3

double ON_ArrayDistance(int dim,double *A,double *B)

{
  undefined1 auVar1 [16];
  int iVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  if (3 < (uint)dim) {
    dVar4 = 0.0;
    lVar3 = 0;
    do {
      dVar4 = dVar4 + (B[lVar3] - A[lVar3]) * (B[lVar3] - A[lVar3]);
      lVar3 = lVar3 + 1;
    } while (dim != (int)lVar3);
LAB_004e8536:
    if (0.0 <= dVar4) {
      return SQRT(dVar4);
    }
    dVar4 = sqrt(dVar4);
    return dVar4;
  }
  switch(dim) {
  case 0:
    dVar4 = 0.0;
    goto LAB_004e8536;
  case 1:
    return ABS(*B - *A);
  case 2:
    dVar4 = ABS(*B - *A);
    dVar5 = ABS(B[1] - A[1]);
    if (dVar4 <= dVar5) {
      if (dVar4 < dVar5) {
        dVar4 = (dVar4 / dVar5) * (dVar4 / dVar5);
LAB_004e85a8:
        return SQRT(dVar4 + 1.0) * dVar5;
      }
      dVar5 = 1.4142135623730951;
      goto LAB_004e858f;
    }
    dVar5 = (dVar5 / dVar4) * (dVar5 / dVar4);
    break;
  case 3:
    dVar7 = *B - *A;
    dVar4 = ABS(dVar7);
    dVar5 = ABS(B[1] - A[1]);
    dVar6 = ABS(B[2] - A[2]);
    if (dVar4 < dVar5) {
      if (dVar6 <= dVar5) {
        dVar4 = (dVar4 / dVar5) * (dVar4 / dVar5) + (dVar6 / dVar5) * (dVar6 / dVar5);
        goto LAB_004e85a8;
      }
LAB_004e8567:
      return SQRT((dVar4 / dVar6) * (dVar4 / dVar6) + (dVar5 / dVar6) * (dVar5 / dVar6) + 1.0) *
             dVar6;
    }
    if (dVar4 < dVar6) goto LAB_004e8567;
    if ((dVar7 == 0.0) && (!NAN(dVar7))) {
      return 0.0;
    }
    auVar1._8_4_ = (int)-(ulong)(dVar4 == dVar6);
    auVar1._0_8_ = -(ulong)(dVar4 == dVar5);
    auVar1._12_4_ = (int)(-(ulong)(dVar4 == dVar6) >> 0x20);
    iVar2 = movmskpd((&switchD_004e8470::switchdataD_006c15c0)[(uint)dim] + 0x6c15c0,auVar1);
    if (iVar2 == 3) {
      dVar5 = 1.7320508075688772;
      goto LAB_004e858f;
    }
    dVar5 = (dVar5 / dVar4) * (dVar5 / dVar4) + (dVar6 / dVar4) * (dVar6 / dVar4);
  }
  dVar5 = SQRT(dVar5 + 1.0);
LAB_004e858f:
  return dVar5 * dVar4;
}

Assistant:

double ON_ArrayDistance(int dim, const double *A, const double *B)
{
  // returns sqrt((A-B)o(A-B))
  double a, b, c, len;
  switch(dim) {
  case 1:
    len = fabs(*B - *A); 
    break;
  case 2:
    a = fabs(*B++ - *A++); b = fabs(*B - *A);
    if (a > b) 
      {b /= a; len = a*sqrt(1.0+b*b);}
    else if (b > a) 
      {a /= b; len = b*sqrt(1.0+a*a);}
    else
      len = a*ON_SQRT2;
    break;
  case 3:
    a = fabs(*B++ - *A++); b = fabs(*B++ - *A++); c = fabs(*B - *A);
    if (a >= b) {
      if (a >= c) {
        if      (a == 0.0)         len = 0.0;
        else if (a == b && a == c) len = a*ON_SQRT3;
        else      {b /= a; c /= a; len = a*sqrt(1.0 + (b*b + c*c));}
      }
      else 
        {a /= c; b /= c; len = c*sqrt(1.0 + (a*a + b*b));}
    }
    else if (b >= c) 
      {a /= b; c /= b; len = b*sqrt(1.0 + (a*a + c*c));}
    else 
      {b /= c; a /= c; len = c*sqrt(1.0 + (a*a + b*b));}
    break;
  default:
    len = 0.0;
    while (dim--) {a = *B++ - *A++; len += a*a;}
    len = sqrt(len);
    break;
  }
  return len;
}